

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Encode
          (GED_BasicGroundCombatSoldier *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EntityID);
  KDataStream::Write<short>(stream,this->m_i16Offsets[0]);
  KDataStream::Write<short>(stream,this->m_i16Offsets[1]);
  KDataStream::Write<short>(stream,this->m_i16Offsets[2]);
  (*(this->m_EA).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EA,stream);
  KDataStream::Write(stream,this->m_i8Ori[0]);
  KDataStream::Write(stream,this->m_i8Ori[1]);
  KDataStream::Write(stream,this->m_i8Ori[2]);
  KDataStream::Write(stream,this->m_i8Spd);
  KDataStream::Write(stream,this->m_i8HdAz);
  KDataStream::Write(stream,this->m_i8HdElv);
  KDataStream::Write(stream,this->m_i8HdScanRt);
  KDataStream::Write(stream,this->m_i8HdElvRt);
  return;
}

Assistant:

void GED_BasicGroundCombatSoldier::Encode( KDataStream & stream ) const
{
    stream << m_ui16EntityID
           << m_i16Offsets[0]
           << m_i16Offsets[1]
           << m_i16Offsets[2]
           << KDIS_STREAM m_EA
           << m_i8Ori[0]
           << m_i8Ori[1]
           << m_i8Ori[2]
           << m_i8Spd
           << m_i8HdAz
           << m_i8HdElv
           << m_i8HdScanRt
           << m_i8HdElvRt;
}